

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::buffer_to_packing_standard_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,
          bool support_std430_without_scalar_layout,bool support_enhanced_layouts)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  allocator local_122;
  allocator local_121;
  string local_120;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  allocator local_82;
  allocator local_81;
  string local_80;
  allocator local_5a;
  allocator local_59;
  string local_58;
  allocator local_35 [18];
  allocator local_23;
  byte local_22;
  byte local_21;
  bool support_enhanced_layouts_local;
  SPIRType *pSStack_20;
  bool support_std430_without_scalar_layout_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  local_22 = support_enhanced_layouts;
  local_21 = support_std430_without_scalar_layout;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if ((support_std430_without_scalar_layout) &&
     (bVar1 = buffer_is_packing_standard(this,type,BufferPackingStd430,(uint32_t *)0x0,0,0xffffffff)
     , bVar1)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"std430",&local_23);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_23);
  }
  else {
    bVar1 = buffer_is_packing_standard
                      (this,pSStack_20,BufferPackingStd140,(uint32_t *)0x0,0,0xffffffff);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"std140",local_35);
      ::std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
    else if ((((this->options).vulkan_semantics & 1U) == 0) ||
            (bVar1 = buffer_is_packing_standard
                               (this,pSStack_20,BufferPackingScalar,(uint32_t *)0x0,0,0xffffffff),
            !bVar1)) {
      if ((((local_21 & 1) == 0) || ((local_22 & 1) == 0)) ||
         (bVar1 = buffer_is_packing_standard
                            (this,pSStack_20,BufferPackingStd430EnhancedLayout,(uint32_t *)0x0,0,
                             0xffffffff), !bVar1)) {
        if (((local_22 & 1) == 0) ||
           (bVar1 = buffer_is_packing_standard
                              (this,pSStack_20,BufferPackingStd140EnhancedLayout,(uint32_t *)0x0,0,
                               0xffffffff), !bVar1)) {
          if (((((this->options).vulkan_semantics & 1U) == 0) || ((local_22 & 1) == 0)) ||
             (bVar1 = buffer_is_packing_standard
                                (this,pSStack_20,BufferPackingScalarEnhancedLayout,(uint32_t *)0x0,0
                                 ,0xffffffff), !bVar1)) {
            if ((((local_21 & 1) == 0) && (((this->options).vulkan_semantics & 1U) != 0)) &&
               (bVar1 = buffer_is_packing_standard
                                  (this,pSStack_20,BufferPackingStd430,(uint32_t *)0x0,0,0xffffffff)
               , bVar1)) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_f8,"GL_EXT_scalar_block_layout",&local_f9);
              require_extension_internal(this,&local_f8);
              ::std::__cxx11::string::~string((string *)&local_f8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)__return_storage_ptr__,"std430",&local_fa);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_fa);
            }
            else {
              if (((((local_21 & 1) != 0) || (((this->options).vulkan_semantics & 1U) == 0)) ||
                  ((local_22 & 1) == 0)) ||
                 (bVar1 = buffer_is_packing_standard
                                    (this,pSStack_20,BufferPackingStd430EnhancedLayout,
                                     (uint32_t *)0x0,0,0xffffffff), !bVar1)) {
                pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (pCVar3,
                           "Buffer block cannot be expressed as any of std430, std140, scalar, even with enhanced layouts. You can try flattening this block to support a more flexible layout."
                          );
                __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              uVar2 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(pSStack_20->super_IVariant).self);
              Compiler::set_extended_decoration
                        (&this->super_Compiler,uVar2,SPIRVCrossDecorationExplicitOffset,0);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_120,"GL_EXT_scalar_block_layout",&local_121);
              require_extension_internal(this,&local_120);
              ::std::__cxx11::string::~string((string *)&local_120);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)__return_storage_ptr__,"std430",&local_122);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_122);
            }
          }
          else {
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSStack_20->super_IVariant).self);
            Compiler::set_extended_decoration
                      (&this->super_Compiler,uVar2,SPIRVCrossDecorationExplicitOffset,0);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_d0,"GL_EXT_scalar_block_layout",&local_d1);
            require_extension_internal(this,&local_d0);
            ::std::__cxx11::string::~string((string *)&local_d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)__return_storage_ptr__,"scalar",&local_d2);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_d2);
          }
        }
        else {
          if ((((this->options).es & 1U) != 0) && (((this->options).vulkan_semantics & 1U) == 0)) {
            pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar3,
                       "Push constant block cannot be expressed as neither std430 nor std140. ES-targets do not support GL_ARB_enhanced_layouts."
                      );
            __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((((this->options).es & 1U) == 0) && (((this->options).vulkan_semantics & 1U) == 0))
             && ((this->options).version < 0x1b8)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_a8,"GL_ARB_enhanced_layouts",&local_a9);
            require_extension_internal(this,&local_a8);
            ::std::__cxx11::string::~string((string *)&local_a8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSStack_20->super_IVariant).self);
          Compiler::set_extended_decoration
                    (&this->super_Compiler,uVar2,SPIRVCrossDecorationExplicitOffset,0);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"std140",&local_aa);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_aa);
        }
      }
      else {
        if ((((this->options).es & 1U) != 0) && (((this->options).vulkan_semantics & 1U) == 0)) {
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar3,
                     "Push constant block cannot be expressed as neither std430 nor std140. ES-targets do not support GL_ARB_enhanced_layouts."
                    );
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (((((this->options).es & 1U) == 0) && (((this->options).vulkan_semantics & 1U) == 0)) &&
           ((this->options).version < 0x1b8)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_80,"GL_ARB_enhanced_layouts",&local_81);
          require_extension_internal(this,&local_80);
          ::std::__cxx11::string::~string((string *)&local_80);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_20->super_IVariant).self);
        Compiler::set_extended_decoration
                  (&this->super_Compiler,uVar2,SPIRVCrossDecorationExplicitOffset,0);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"std430",&local_82);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_82);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_58,"GL_EXT_scalar_block_layout",&local_59);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"scalar",&local_5a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::buffer_to_packing_standard(const SPIRType &type,
                                                bool support_std430_without_scalar_layout,
                                                bool support_enhanced_layouts)
{
	if (support_std430_without_scalar_layout && buffer_is_packing_standard(type, BufferPackingStd430))
		return "std430";
	else if (buffer_is_packing_standard(type, BufferPackingStd140))
		return "std140";
	else if (options.vulkan_semantics && buffer_is_packing_standard(type, BufferPackingScalar))
	{
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "scalar";
	}
	else if (support_std430_without_scalar_layout &&
	         support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingStd430EnhancedLayout))
	{
		if (options.es && !options.vulkan_semantics)
			SPIRV_CROSS_THROW("Push constant block cannot be expressed as neither std430 nor std140. ES-targets do "
			                  "not support GL_ARB_enhanced_layouts.");
		if (!options.es && !options.vulkan_semantics && options.version < 440)
			require_extension_internal("GL_ARB_enhanced_layouts");

		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		return "std430";
	}
	else if (support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingStd140EnhancedLayout))
	{
		// Fallback time. We might be able to use the ARB_enhanced_layouts to deal with this difference,
		// however, we can only use layout(offset) on the block itself, not any substructs, so the substructs better be the appropriate layout.
		// Enhanced layouts seem to always work in Vulkan GLSL, so no need for extensions there.
		if (options.es && !options.vulkan_semantics)
			SPIRV_CROSS_THROW("Push constant block cannot be expressed as neither std430 nor std140. ES-targets do "
			                  "not support GL_ARB_enhanced_layouts.");
		if (!options.es && !options.vulkan_semantics && options.version < 440)
			require_extension_internal("GL_ARB_enhanced_layouts");

		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		return "std140";
	}
	else if (options.vulkan_semantics &&
	         support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingScalarEnhancedLayout))
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "scalar";
	}
	else if (!support_std430_without_scalar_layout && options.vulkan_semantics &&
	         buffer_is_packing_standard(type, BufferPackingStd430))
	{
		// UBOs can support std430 with GL_EXT_scalar_block_layout.
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "std430";
	}
	else if (!support_std430_without_scalar_layout && options.vulkan_semantics &&
	         support_enhanced_layouts &&
	         buffer_is_packing_standard(type, BufferPackingStd430EnhancedLayout))
	{
		// UBOs can support std430 with GL_EXT_scalar_block_layout.
		set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
		require_extension_internal("GL_EXT_scalar_block_layout");
		return "std430";
	}
	else
	{
		SPIRV_CROSS_THROW("Buffer block cannot be expressed as any of std430, std140, scalar, even with enhanced "
		                  "layouts. You can try flattening this block to support a more flexible layout.");
	}
}